

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

void __thiscall
duckdb::BaseAppender::AppendValueInternal<unsigned_long,unsigned_int>
          (BaseAppender *this,Vector *col,unsigned_long input)

{
  bool bVar1;
  undefined1 auVar2 [16];
  uint result;
  uint32_t local_44;
  string local_40;
  
  bVar1 = TryCast::Operation<unsigned_long,unsigned_int>(input,&local_44,false);
  if (bVar1) {
    *(uint32_t *)(col->data + (this->chunk).count * 4) = local_44;
    return;
  }
  auVar2 = __cxa_allocate_exception(0x10);
  CastExceptionText<unsigned_long,unsigned_int>(&local_40,(duckdb *)input,auVar2._8_8_);
  InvalidInputException::InvalidInputException(auVar2._0_8_,(string *)&local_40);
  __cxa_throw(auVar2._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}